

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::checkQueryTimeouts(CommonCore *this)

{
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int index;
  bool bVar1;
  _Elt_pointer ppVar2;
  _Elt_pointer ppVar3;
  _Map_pointer pppVar4;
  string local_80;
  long local_60;
  _Elt_pointer local_58;
  string local_50;
  
  if ((this->queryTimeouts).
      super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->queryTimeouts).
      super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_60 = std::chrono::_V2::steady_clock::now();
    ppVar3 = (this->queryTimeouts).
             super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_58 = (this->queryTimeouts).
               super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar3 != local_58) {
      ppVar2 = (this->queryTimeouts).
               super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      pppVar4 = (this->queryTimeouts).
                super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      this_00 = &this->activeQueries;
      do {
        bVar1 = gmlc::concurrency::
                DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::isRecognized(this_00,ppVar3->first);
        if (((bVar1) &&
            (bVar1 = gmlc::concurrency::
                     DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::isCompleted(this_00,ppVar3->first), !bVar1)) &&
           ((this->super_BrokerBase).queryTimeout.internalTimeCode <
            local_60 - (ppVar3->second).__d.__r)) {
          index = ppVar3->first;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"query timeout","");
          generateJsonErrorResponse(&local_50,GATEWAY_TIMEOUT,&local_80);
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue(this_00,index,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          ppVar3->first = 0;
        }
        ppVar3 = ppVar3 + 1;
        if (ppVar3 == ppVar2) {
          ppVar3 = pppVar4[1];
          pppVar4 = pppVar4 + 1;
          ppVar2 = ppVar3 + 0x20;
        }
      } while (ppVar3 != local_58);
    }
    ppVar3 = (this->queryTimeouts).
             super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    bVar1 = (this->queryTimeouts).
            super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar3;
    if (!bVar1) {
      if (ppVar3->first == 0) {
        do {
          std::
          deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ::pop_front(&this->queryTimeouts);
          ppVar3 = (this->queryTimeouts).
                   super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          bVar1 = (this->queryTimeouts).
                  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar3;
          if (bVar1) goto LAB_002b74e8;
        } while (ppVar3->first == 0);
      }
      if (!bVar1) {
        return;
      }
    }
LAB_002b74e8:
    BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,false);
  }
  return;
}

Assistant:

void CommonCore::unregister()
{
    /*We need to ensure that the destructor is not called immediately upon calling unregister
    otherwise this would be a mess and probably cause segmentation faults so we capture it in a
    local variable that will be destroyed on function exit
    */
    auto keepCoreAlive = CoreFactory::findCore(identifier);
    if (keepCoreAlive) {
        if (keepCoreAlive.get() == this) {
            CoreFactory::unregisterCore(identifier);
        }
    }

    if (!prevIdentifier.empty()) {
        auto keepCoreAlive2 = CoreFactory::findCore(prevIdentifier);
        if (keepCoreAlive2) {
            if (keepCoreAlive2.get() == this) {
                CoreFactory::unregisterCore(prevIdentifier);
            }
        }
    }
}